

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::C_CopyObject
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_OBJECT_HANDLE hObject,
          CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,CK_OBJECT_HANDLE_PTR phNewObject)

{
  SessionObjectStore *this_00;
  _func_int **pp_Var1;
  HandleManager *this_01;
  char cVar2;
  byte isPrivateObject;
  bool bVar3;
  char extraout_AL;
  int iVar4;
  Session *this_02;
  Slot *this_03;
  Token *this_04;
  long *plVar5;
  CK_STATE CVar6;
  unsigned_long *puVar7;
  SessionObject *object;
  ByteString *pBVar8;
  size_t sVar9;
  CK_SLOT_ID CVar10;
  CK_OBJECT_HANDLE CVar11;
  CK_ULONG CVar12;
  CK_RV CVar13;
  char *format;
  byte bVar14;
  byte isPrivateObject_00;
  ByteString value;
  P11Object *newp11object;
  CK_BBOOL local_1da;
  long local_1d0;
  ByteString local_198;
  OSAttribute local_170;
  OSAttribute local_d0;
  
  CVar13 = 400;
  if ((this->isInitialised == true) &&
     (CVar13 = 7, phNewObject != (CK_OBJECT_HANDLE_PTR)0x0 && pTemplate != (CK_ATTRIBUTE_PTR)0x0)) {
    *phNewObject = 0;
    this_02 = (Session *)HandleManager::getSession(this->handleManager,hSession);
    if (this_02 == (Session *)0x0) {
      CVar13 = 0xb3;
    }
    else {
      this_03 = Session::getSlot(this_02);
      CVar13 = 5;
      if ((this_03 != (Slot *)0x0) &&
         (this_04 = Session::getToken(this_02), this_04 != (Token *)0x0)) {
        plVar5 = (long *)HandleManager::getObject(this->handleManager,hObject);
        CVar13 = 0x82;
        if ((plVar5 != (long *)0x0) &&
           (cVar2 = (**(code **)(*plVar5 + 0x50))(plVar5), cVar2 != '\0')) {
          local_1da = (**(code **)(*plVar5 + 0x20))(plVar5,1,0);
          isPrivateObject = (**(code **)(*plVar5 + 0x20))(plVar5,2,1);
          CVar6 = Session::getState(this_02);
          CVar13 = haveRead(CVar6,local_1da,isPrivateObject);
          if (CVar13 == 0) {
            cVar2 = (**(code **)(*plVar5 + 0x20))(plVar5,0x171,1);
            if (cVar2 == '\0') {
              return 0x1b;
            }
            isPrivateObject_00 = isPrivateObject;
            if (ulCount != 0) {
              puVar7 = &pTemplate->ulValueLen;
              CVar12 = ulCount;
              do {
                if (((_CK_ATTRIBUTE *)(puVar7 + -2))->type == 2) {
                  if (*puVar7 == 1) {
                    isPrivateObject_00 = *(byte *)puVar7[-1];
                  }
                }
                else if ((((_CK_ATTRIBUTE *)(puVar7 + -2))->type == 1) && (*puVar7 == 1)) {
                  local_1da = *(CK_BBOOL *)puVar7[-1];
                }
                puVar7 = puVar7 + 3;
                CVar12 = CVar12 - 1;
              } while (CVar12 != 0);
            }
            if (((isPrivateObject ^ 1) == 0) && (isPrivateObject_00 == 0)) {
              return 0xd1;
            }
            CVar6 = Session::getState(this_02);
            CVar13 = haveWrite(CVar6,local_1da,isPrivateObject_00);
            if (CVar13 == 0) {
              if (local_1da == '\0') {
                this_00 = this->sessionObjectStore;
                CVar10 = Slot::getSlotID(this_03);
                object = SessionObjectStore::createObject
                                   (this_00,CVar10,hSession,isPrivateObject_00 != 0);
              }
              else {
                object = (SessionObject *)Token::createObject(this_04);
              }
              if (object == (SessionObject *)0x0) {
                return 5;
              }
              iVar4 = (*(object->super_OSObject)._vptr_OSObject[0xb])(object,1);
              if ((char)iVar4 == '\0') {
                (*(object->super_OSObject)._vptr_OSObject[0xe])(object);
                return 6;
              }
              CVar13 = 0;
              local_1d0 = 0;
              while (cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,local_1d0), cVar2 != '\0') {
                (**(code **)(*plVar5 + 0x18))(&local_170,plVar5,local_1d0);
                if ((((isPrivateObject ^ 1) & isPrivateObject_00 != 0) == 0) ||
                   (bVar3 = OSAttribute::isByteStringAttribute(&local_170), !bVar3)) {
LAB_0012eb97:
                  iVar4 = (*(object->super_OSObject)._vptr_OSObject[8])(object,local_1d0,&local_170)
                  ;
                  if ((char)iVar4 == '\0') {
                    CVar13 = 6;
                    bVar14 = 1;
                  }
                  else {
LAB_0012ebae:
                    local_1d0 = (**(code **)(*plVar5 + 0x38))(plVar5,local_1d0);
                    bVar14 = 0;
                  }
                }
                else {
                  pBVar8 = OSAttribute::getByteStringValue(&local_170);
                  sVar9 = ByteString::size(pBVar8);
                  if (sVar9 == 0) goto LAB_0012eb97;
                  ByteString::ByteString(&local_198);
                  pBVar8 = OSAttribute::getByteStringValue(&local_170);
                  Token::encrypt(this_04,(char *)pBVar8,(int)&local_198);
                  bVar14 = 1;
                  if (extraout_AL != '\0') {
                    OSAttribute::OSAttribute(&local_d0,&local_198);
                    iVar4 = (*(object->super_OSObject)._vptr_OSObject[8])
                                      (object,local_1d0,&local_d0);
                    bVar14 = (byte)iVar4 ^ 1;
                    OSAttribute::~OSAttribute(&local_d0);
                  }
                  local_198._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
                  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                            (&local_198.byteString.
                              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
                  if (bVar14 == 0) goto LAB_0012ebae;
                  CVar13 = 6;
                }
                OSAttribute::~OSAttribute(&local_170);
                if ((bVar14 != 0) || (local_1d0 == 0)) goto LAB_0012ec08;
              }
              CVar13 = 6;
LAB_0012ec08:
              pp_Var1 = (object->super_OSObject)._vptr_OSObject;
              if (CVar13 == 0) {
                iVar4 = (*pp_Var1[0xc])();
                CVar13 = 6;
                if ((char)iVar4 != '\0') {
                  CVar13 = 0;
                }
              }
              else {
                (*pp_Var1[0xd])();
              }
              if (CVar13 == 0) {
                local_170._vptr_OSAttribute = (_func_int **)0x0;
                CVar13 = newP11Object(&object->super_OSObject,(P11Object **)&local_170);
                pp_Var1 = local_170._vptr_OSAttribute;
                if (CVar13 == 0) {
                  CVar13 = P11Object::saveTemplate
                                     ((P11Object *)local_170._vptr_OSAttribute,this_04,
                                      isPrivateObject_00 != 0,pTemplate,ulCount,1);
                  (*(*(_func_int ***)pp_Var1)[1])(pp_Var1);
                  if (CVar13 == 0) {
                    this_01 = this->handleManager;
                    CVar10 = Slot::getSlotID(this_03);
                    if (local_1da == '\0') {
                      CVar11 = HandleManager::addSessionObject
                                         (this_01,CVar10,hSession,isPrivateObject_00 != 0,object);
                    }
                    else {
                      CVar11 = HandleManager::addTokenObject
                                         (this_01,CVar10,isPrivateObject_00 != 0,object);
                    }
                    *phNewObject = CVar11;
                    return 0;
                  }
                }
              }
              (*(object->super_OSObject)._vptr_OSObject[0xe])();
              return CVar13;
            }
            if (CVar13 == 0xb5) {
              format = "Session is read-only";
              iVar4 = 0x67c;
            }
            else {
              if (CVar13 != 0x101) {
                return CVar13;
              }
              format = "User is not authorized";
              iVar4 = 0x67a;
            }
          }
          else {
            if (CVar13 != 0x101) {
              return CVar13;
            }
            format = "User is not authorized";
            iVar4 = 0x657;
            CVar13 = 0x101;
          }
          softHSMLog(6,"C_CopyObject",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,iVar4,format);
        }
      }
    }
  }
  return CVar13;
}

Assistant:

CK_RV SoftHSM::C_CopyObject(CK_SESSION_HANDLE hSession, CK_OBJECT_HANDLE hObject, CK_ATTRIBUTE_PTR pTemplate, CK_ULONG ulCount, CK_OBJECT_HANDLE_PTR phNewObject)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pTemplate == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (phNewObject == NULL_PTR) return CKR_ARGUMENTS_BAD;
	*phNewObject = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the slot
	Slot* slot = session->getSlot();
	if (slot == NULL_PTR) return CKR_GENERAL_ERROR;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL_PTR) return CKR_GENERAL_ERROR;

	// Check the object handle.
	OSObject *object = (OSObject *)handleManager->getObject(hObject);
	if (object == NULL_PTR || !object->isValid()) return CKR_OBJECT_HANDLE_INVALID;

	CK_BBOOL wasOnToken = object->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL wasPrivate = object->getBooleanValue(CKA_PRIVATE, true);

	// Check read user credentials
	CK_RV rv = haveRead(session->getState(), wasOnToken, wasPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check if the object is copyable
	CK_BBOOL isCopyable = object->getBooleanValue(CKA_COPYABLE, true);
	if (!isCopyable) return CKR_ACTION_PROHIBITED;

	// Extract critical information from the template
	CK_BBOOL isOnToken = wasOnToken;
	CK_BBOOL isPrivate = wasPrivate;

	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		if ((pTemplate[i].type == CKA_TOKEN) && (pTemplate[i].ulValueLen == sizeof(CK_BBOOL)))
		{
			isOnToken = *(CK_BBOOL*)pTemplate[i].pValue;
			continue;
		}
		if ((pTemplate[i].type == CKA_PRIVATE) && (pTemplate[i].ulValueLen == sizeof(CK_BBOOL)))
		{
			isPrivate = *(CK_BBOOL*)pTemplate[i].pValue;
			continue;
		}
	}

	// Check privacy does not downgrade
	if (wasPrivate && !isPrivate) return CKR_TEMPLATE_INCONSISTENT;

	// Check write user credentials
	rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Create the object in session or on the token
	OSObject *newobject = NULL_PTR;
	if (isOnToken)
	{
		newobject = (OSObject*) token->createObject();
	}
	else
	{
		newobject = sessionObjectStore->createObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE);
	}
	if (newobject == NULL) return CKR_GENERAL_ERROR;

	// Copy attributes from object class (CKA_CLASS=0 so the first)
	if (!newobject->startTransaction())
	{
		newobject->destroyObject();
		return CKR_FUNCTION_FAILED;
	}

	CK_ATTRIBUTE_TYPE attrType = CKA_CLASS;
	do
	{
		if (!object->attributeExists(attrType))
		{
			rv = CKR_FUNCTION_FAILED;
			break;
		}

		OSAttribute attr = object->getAttribute(attrType);

		// Upgrade privacy has to encrypt byte strings
		if (!wasPrivate && isPrivate &&
		    attr.isByteStringAttribute() &&
		    attr.getByteStringValue().size() != 0)
		{
			ByteString value;
			if (!token->encrypt(attr.getByteStringValue(), value) ||
			    !newobject->setAttribute(attrType, value))
			{
				rv = CKR_FUNCTION_FAILED;
				break;
			}
		}
		else
		{
			if (!newobject->setAttribute(attrType, attr))
			{
				rv = CKR_FUNCTION_FAILED;
				break;
			}
		}
		attrType = object->nextAttributeType(attrType);
	}
	while (attrType != CKA_CLASS);

	if (rv != CKR_OK)
	{
		newobject->abortTransaction();
	}
	else if (!newobject->commitTransaction())
	{
		rv = CKR_FUNCTION_FAILED;
	}

	if (rv != CKR_OK)
	{
		newobject->destroyObject();
		return rv;
	}

	// Get the new P11 object
	P11Object* newp11object = NULL;
	rv = newP11Object(newobject,&newp11object);
	if (rv != CKR_OK)
	{
		newobject->destroyObject();
		return rv;
	}

	// Apply the template
	rv = newp11object->saveTemplate(token, isPrivate != CK_FALSE, pTemplate, ulCount, OBJECT_OP_COPY);
	delete newp11object;

	if (rv != CKR_OK)
	{
		newobject->destroyObject();
		return rv;
	}

	// Set handle
	if (isOnToken)
	{
		*phNewObject = handleManager->addTokenObject(slot->getSlotID(), isPrivate != CK_FALSE, newobject);
	}
	else
	{
		*phNewObject = handleManager->addSessionObject(slot->getSlotID(), hSession, isPrivate != CK_FALSE, newobject);
	}

	return CKR_OK;
}